

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.cpp
# Opt level: O3

Character * __thiscall World::GetCharacterReal(World *this,string *real_name)

{
  pointer ppCVar1;
  size_t __n;
  Character *pCVar2;
  int iVar3;
  pointer ppCVar4;
  string local_48;
  
  util::lowercase(&local_48,real_name);
  std::__cxx11::string::operator=((string *)real_name,(string *)&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  ppCVar4 = (this->characters).super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl
            .super__Vector_impl_data._M_start;
  ppCVar1 = (this->characters).super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl
            .super__Vector_impl_data._M_finish;
  if (ppCVar4 != ppCVar1) {
    __n = real_name->_M_string_length;
    do {
      pCVar2 = *ppCVar4;
      if ((pCVar2->real_name)._M_string_length == __n) {
        if (__n == 0) {
          return pCVar2;
        }
        iVar3 = bcmp((pCVar2->real_name)._M_dataplus._M_p,(real_name->_M_dataplus)._M_p,__n);
        if (iVar3 == 0) {
          return pCVar2;
        }
      }
      ppCVar4 = ppCVar4 + 1;
    } while (ppCVar4 != ppCVar1);
  }
  return (Character *)0x0;
}

Assistant:

Character *World::GetCharacterReal(std::string real_name)
{
	real_name = util::lowercase(real_name);

	UTIL_FOREACH(this->characters, character)
	{
		if (character->real_name == real_name)
		{
			return character;
		}
	}

	return 0;
}